

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManagedStatic.h
# Opt level: O0

void * llvm::object_creator<(anonymous_namespace)::CommandLineParser>::call(void)

{
  CommandLineParser *this;
  
  this = (CommandLineParser *)operator_new(0x130);
  anon_unknown.dwarf_23046::CommandLineParser::CommandLineParser(this);
  return this;
}

Assistant:

static void *call() { return new C(); }